

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTest.cxx
# Opt level: O0

void __thiscall cmTest::~cmTest(cmTest *this)

{
  cmTest *this_local;
  
  cmListFileBacktrace::~cmListFileBacktrace(&this->Backtrace);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Command);
  std::__cxx11::string::~string((string *)&this->Name);
  cmPropertyMap::~cmPropertyMap(&this->Properties);
  return;
}

Assistant:

cmTest::~cmTest() = default;